

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DBSCAN.cpp
# Opt level: O1

void __thiscall DBSCAN::SetArrivalEmbs(DBSCAN *this,Embedding *emb)

{
  pointer pEVar1;
  iterator __position;
  ulong uVar2;
  DBSCAN *this_00;
  long lVar3;
  float fVar4;
  uint local_109c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_1098;
  DBSCAN *local_1090;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_1088;
  undefined1 local_1080 [2080];
  pointer local_860;
  Embedding local_858;
  
  if (this->emb_num != 0) {
    lVar3 = 0x810;
    local_1088 = &local_858.arrival_embs;
    local_1090 = (DBSCAN *)(local_1080 + 0x810);
    local_1098 = &emb->arrival_embs;
    uVar2 = 0;
    do {
      pEVar1 = (this->embs).super__Vector_base<Embedding,_std::allocator<Embedding>_>._M_impl.
               super__Vector_impl_data._M_start;
      memcpy(&local_858,(void *)((long)pEVar1 + lVar3 + -0x810),0x810);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (local_1088,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)pEVar1->emb + lVar3 + -4));
      memcpy((Embedding *)local_1080,emb,0x810);
      this_00 = local_1090;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1090,local_1098);
      fVar4 = GetDistance(this_00,&local_858,(Embedding *)local_1080);
      if ((pointer)local_1080._2064_8_ != (pointer)0x0) {
        operator_delete((void *)local_1080._2064_8_,(long)local_860 - local_1080._2064_8_);
      }
      if (local_858.arrival_embs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_858.arrival_embs.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_858.arrival_embs.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_858.arrival_embs.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((this->radius <= fVar4) && (uVar2 != emb->emb_id)) {
        local_109c = (uint)uVar2;
        __position._M_current =
             (emb->arrival_embs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (emb->arrival_embs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (local_1098,__position,&local_109c);
        }
        else {
          *__position._M_current = local_109c;
          (emb->arrival_embs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x828;
    } while (uVar2 < this->emb_num);
  }
  emb->is_key = (ulong)this->min_embs <=
                (ulong)((long)(emb->arrival_embs).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(emb->arrival_embs).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 2);
  return;
}

Assistant:

void DBSCAN::SetArrivalEmbs(Embedding& emb)
{
    for(unsigned long i=0; i<this->emb_num; i++)                //对每个数据点执行
    {
        float distance = this->GetDistance(embs[i], emb);    //获取与特定点之间的距离
        if(distance >= radius && i!=emb.GetEmbID())        //若距离小于半径，并且特定点的id与dp的id不同执行
            emb.GetArrivalEmbs().push_back(i);            //将特定点id压力dp的领域列表中
    }
    if(emb.GetArrivalEmbs().size() >= this->min_embs)            //若dp领域内数据点数据量> minPTs执行
    {
        emb.SetKey(true);    //将dp核心对象标志位设为true
        return;                //返回
    }
    emb.SetKey(false);    //若非核心对象，则将dp核心对象标志位设为false
}